

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void fadst4x4_sse4_1(__m128i *in,__m128i *out,int bit,int num_col)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar14;
  int iVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar16;
  int iVar17;
  int iVar19;
  int iVar20;
  undefined1 auVar18 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  iVar6 = bit + -10;
  iVar7 = 1 << ((char)bit - 1U & 0x1f);
  iVar4 = av1_sinpi_arr_data[iVar6][1];
  auVar22._4_4_ = iVar4;
  auVar22._0_4_ = iVar4;
  auVar22._8_4_ = iVar4;
  auVar22._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar6][2];
  auVar25._4_4_ = iVar4;
  auVar25._0_4_ = iVar4;
  auVar25._8_4_ = iVar4;
  auVar25._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar6][3];
  iVar5 = av1_sinpi_arr_data[iVar6][4];
  auVar12._4_4_ = iVar5;
  auVar12._0_4_ = iVar5;
  auVar12._8_4_ = iVar5;
  auVar12._12_4_ = iVar5;
  alVar1 = *in;
  auVar23 = pmulld((undefined1  [16])alVar1,auVar22);
  auVar18 = pmulld(auVar12,(undefined1  [16])alVar1);
  alVar2 = in[num_col];
  auVar26 = pmulld((undefined1  [16])alVar2,auVar25);
  auVar24 = pmulld((undefined1  [16])alVar2,auVar22);
  auVar13._4_4_ = iVar4;
  auVar13._0_4_ = iVar4;
  auVar13._8_4_ = iVar4;
  auVar13._12_4_ = iVar4;
  auVar22 = pmulld((undefined1  [16])in[num_col * 2],auVar13);
  alVar3 = in[num_col * 3];
  auVar13 = pmulld(auVar12,(undefined1  [16])alVar3);
  iVar11 = auVar13._0_4_ + auVar26._0_4_ + auVar23._0_4_;
  iVar14 = auVar13._4_4_ + auVar26._4_4_ + auVar23._4_4_;
  iVar15 = auVar13._8_4_ + auVar26._8_4_ + auVar23._8_4_;
  iVar16 = auVar13._12_4_ + auVar26._12_4_ + auVar23._12_4_;
  auVar13 = pmulld(auVar25,(undefined1  [16])alVar3);
  iVar6 = auVar13._0_4_ + (auVar18._0_4_ - auVar24._0_4_);
  iVar8 = auVar13._4_4_ + (auVar18._4_4_ - auVar24._4_4_);
  iVar9 = auVar13._8_4_ + (auVar18._8_4_ - auVar24._8_4_);
  iVar10 = auVar13._12_4_ + (auVar18._12_4_ - auVar24._12_4_);
  auVar23._0_4_ = ((int)alVar1[0] + (int)alVar2[0]) - (int)alVar3[0];
  auVar23._4_4_ = (alVar1[0]._4_4_ + alVar2[0]._4_4_) - alVar3[0]._4_4_;
  auVar23._8_4_ = ((int)alVar1[1] + (int)alVar2[1]) - (int)alVar3[1];
  auVar23._12_4_ = (alVar1[1]._4_4_ + alVar2[1]._4_4_) - alVar3[1]._4_4_;
  iVar17 = auVar22._0_4_ + iVar7;
  iVar19 = auVar22._4_4_ + iVar7;
  iVar20 = auVar22._8_4_ + iVar7;
  iVar21 = auVar22._12_4_ + iVar7;
  auVar25 = ZEXT416((uint)bit);
  auVar18._4_4_ = iVar4;
  auVar18._0_4_ = iVar4;
  auVar18._8_4_ = iVar4;
  auVar18._12_4_ = iVar4;
  auVar13 = pmulld(auVar23,auVar18);
  *(int *)*out = iVar17 + iVar11 >> auVar25;
  *(int *)((long)*out + 4) = iVar19 + iVar14 >> auVar25;
  *(int *)(*out + 1) = iVar20 + iVar15 >> auVar25;
  *(int *)((long)*out + 0xc) = iVar21 + iVar16 >> auVar25;
  *(int *)out[1] = auVar13._0_4_ + iVar7 >> auVar25;
  *(int *)((long)out[1] + 4) = auVar13._4_4_ + iVar7 >> auVar25;
  *(int *)(out[1] + 1) = auVar13._8_4_ + iVar7 >> auVar25;
  *(int *)((long)out[1] + 0xc) = auVar13._12_4_ + iVar7 >> auVar25;
  *(int *)out[2] = (iVar7 - auVar22._0_4_) + iVar6 >> auVar25;
  *(int *)((long)out[2] + 4) = (iVar7 - auVar22._4_4_) + iVar8 >> auVar25;
  *(int *)(out[2] + 1) = (iVar7 - auVar22._8_4_) + iVar9 >> auVar25;
  *(int *)((long)out[2] + 0xc) = (iVar7 - auVar22._12_4_) + iVar10 >> auVar25;
  *(int *)out[3] = (iVar17 - iVar11) + iVar6 >> auVar25;
  *(int *)((long)out[3] + 4) = (iVar19 - iVar14) + iVar8 >> auVar25;
  *(int *)(out[3] + 1) = (iVar20 - iVar15) + iVar9 >> auVar25;
  *(int *)((long)out[3] + 0xc) = (iVar21 - iVar16) + iVar10 >> auVar25;
  return;
}

Assistant:

static void fadst4x4_sse4_1(__m128i *in, __m128i *out, int bit,
                            const int num_col) {
  const int32_t *sinpi = sinpi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i sinpi1 = _mm_set1_epi32((int)sinpi[1]);
  const __m128i sinpi2 = _mm_set1_epi32((int)sinpi[2]);
  const __m128i sinpi3 = _mm_set1_epi32((int)sinpi[3]);
  const __m128i sinpi4 = _mm_set1_epi32((int)sinpi[4]);
  __m128i t;
  __m128i s0, s1, s2, s3, s4, s5, s6, s7;
  __m128i x0, x1, x2, x3;
  __m128i u0, u1, u2, u3;

  int idx = 0 * num_col;
  s0 = _mm_mullo_epi32(in[idx], sinpi1);
  s1 = _mm_mullo_epi32(in[idx], sinpi4);
  t = _mm_add_epi32(in[idx], in[idx + num_col]);
  idx += num_col;
  s2 = _mm_mullo_epi32(in[idx], sinpi2);
  s3 = _mm_mullo_epi32(in[idx], sinpi1);
  idx += num_col;
  s4 = _mm_mullo_epi32(in[idx], sinpi3);
  idx += num_col;
  s5 = _mm_mullo_epi32(in[idx], sinpi4);
  s6 = _mm_mullo_epi32(in[idx], sinpi2);
  s7 = _mm_sub_epi32(t, in[idx]);

  t = _mm_add_epi32(s0, s2);
  x0 = _mm_add_epi32(t, s5);
  x1 = _mm_mullo_epi32(s7, sinpi3);
  t = _mm_sub_epi32(s1, s3);
  x2 = _mm_add_epi32(t, s6);
  x3 = s4;

  s0 = _mm_add_epi32(x0, x3);
  s1 = x1;
  s2 = _mm_sub_epi32(x2, x3);
  t = _mm_sub_epi32(x2, x0);
  s3 = _mm_add_epi32(t, x3);

  u0 = _mm_add_epi32(s0, rnding);
  u0 = _mm_srai_epi32(u0, bit);

  u1 = _mm_add_epi32(s1, rnding);
  u1 = _mm_srai_epi32(u1, bit);

  u2 = _mm_add_epi32(s2, rnding);
  u2 = _mm_srai_epi32(u2, bit);

  u3 = _mm_add_epi32(s3, rnding);
  u3 = _mm_srai_epi32(u3, bit);

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;
}